

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

int32_t __thiscall
icu_63::MessagePattern::parseChoiceStyle
          (MessagePattern *this,int32_t index,int32_t nestingLevel,UParseError *parseError,
          UErrorCode *errorCode)

{
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  int32_t iVar4;
  UChar c;
  int32_t length;
  int32_t numberIndex;
  int32_t start;
  UErrorCode *errorCode_local;
  UParseError *parseError_local;
  int32_t nestingLevel_local;
  int32_t index_local;
  MessagePattern *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    parseError_local._4_4_ = skipWhiteSpace(this,index);
    iVar3 = UnicodeString::length(&this->msg);
    if ((parseError_local._4_4_ == iVar3) ||
       (cVar2 = UnicodeString::charAt(&this->msg,parseError_local._4_4_), cVar2 == L'}')) {
      setParseError(this,parseError,0);
      *errorCode = U_PATTERN_SYNTAX_ERROR;
    }
    else {
      while( true ) {
        iVar3 = skipDouble(this,parseError_local._4_4_);
        if (iVar3 == parseError_local._4_4_) break;
        if (0xffff < iVar3 - parseError_local._4_4_) {
          setParseError(this,parseError,parseError_local._4_4_);
          *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
          return 0;
        }
        parseDouble(this,parseError_local._4_4_,iVar3,'\x01',parseError,errorCode);
        UVar1 = ::U_FAILURE(*errorCode);
        if (UVar1 != '\0') {
          return 0;
        }
        iVar3 = skipWhiteSpace(this,iVar3);
        iVar4 = UnicodeString::length(&this->msg);
        if (iVar3 == iVar4) {
          setParseError(this,parseError,index);
          *errorCode = U_PATTERN_SYNTAX_ERROR;
          return 0;
        }
        cVar2 = UnicodeString::charAt(&this->msg,iVar3);
        if (((cVar2 != L'#') && (cVar2 != L'<')) && (cVar2 != L'≤')) {
          setParseError(this,parseError,index);
          *errorCode = U_PATTERN_SYNTAX_ERROR;
          return 0;
        }
        addPart(this,UMSGPAT_PART_TYPE_ARG_SELECTOR,iVar3,1,0,errorCode);
        iVar3 = parseMessage(this,iVar3 + 1,0,nestingLevel + 1,UMSGPAT_ARG_TYPE_CHOICE,parseError,
                             errorCode);
        UVar1 = ::U_FAILURE(*errorCode);
        if (UVar1 != '\0') {
          return 0;
        }
        iVar4 = UnicodeString::length(&this->msg);
        if (iVar3 == iVar4) {
          return iVar3;
        }
        cVar2 = UnicodeString::charAt(&this->msg,iVar3);
        if (cVar2 == L'}') {
          UVar1 = inMessageFormatPattern(this,nestingLevel);
          if (UVar1 == '\0') {
            setParseError(this,parseError,index);
            *errorCode = U_PATTERN_SYNTAX_ERROR;
            return 0;
          }
          return iVar3;
        }
        parseError_local._4_4_ = skipWhiteSpace(this,iVar3 + 1);
      }
      setParseError(this,parseError,index);
      *errorCode = U_PATTERN_SYNTAX_ERROR;
    }
  }
  return 0;
}

Assistant:

int32_t
MessagePattern::parseChoiceStyle(int32_t index, int32_t nestingLevel,
                                 UParseError *parseError, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t start=index;
    index=skipWhiteSpace(index);
    if(index==msg.length() || msg.charAt(index)==u_rightCurlyBrace) {
        setParseError(parseError, 0);  // Missing choice argument pattern.
        errorCode=U_PATTERN_SYNTAX_ERROR;
        return 0;
    }
    for(;;) {
        // The choice argument style contains |-separated (number, separator, message) triples.
        // Parse the number.
        int32_t numberIndex=index;
        index=skipDouble(index);
        int32_t length=index-numberIndex;
        if(length==0) {
            setParseError(parseError, start);  // Bad choice pattern syntax.
            errorCode=U_PATTERN_SYNTAX_ERROR;
            return 0;
        }
        if(length>Part::MAX_LENGTH) {
            setParseError(parseError, numberIndex);  // Choice number too long.
            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
        parseDouble(numberIndex, index, TRUE, parseError, errorCode);  // adds ARG_INT or ARG_DOUBLE
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        // Parse the separator.
        index=skipWhiteSpace(index);
        if(index==msg.length()) {
            setParseError(parseError, start);  // Bad choice pattern syntax.
            errorCode=U_PATTERN_SYNTAX_ERROR;
            return 0;
        }
        UChar c=msg.charAt(index);
        if(!(c==u_pound || c==u_lessThan || c==u_lessOrEqual)) {  // U+2264 is <=
            setParseError(parseError, start);  // Expected choice separator (#<\u2264) instead of c.
            errorCode=U_PATTERN_SYNTAX_ERROR;
            return 0;
        }
        addPart(UMSGPAT_PART_TYPE_ARG_SELECTOR, index, 1, 0, errorCode);
        // Parse the message fragment.
        index=parseMessage(++index, 0, nestingLevel+1, UMSGPAT_ARG_TYPE_CHOICE, parseError, errorCode);
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        // parseMessage(..., CHOICE) returns the index of the terminator, or msg.length().
        if(index==msg.length()) {
            return index;
        }
        if(msg.charAt(index)==u_rightCurlyBrace) {
            if(!inMessageFormatPattern(nestingLevel)) {
                setParseError(parseError, start);  // Bad choice pattern syntax.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            return index;
        }  // else the terminator is '|'
        index=skipWhiteSpace(index+1);
    }
}